

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::prog_tmp(SSPMSolver *this,int pindex,int h)

{
  int iVar1;
  bool bVar2;
  undefined1 local_d8 [24];
  undefined1 local_c0 [4];
  int k_2;
  int local_b0;
  int local_ac;
  int new_d_2;
  int k_1;
  int local_94;
  undefined1 local_90 [4];
  int new_d_1;
  int local_80;
  int k;
  int new_d;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  undefined1 local_40 [4];
  int i_1;
  undefined1 local_30 [28];
  int i;
  int h_local;
  int pindex_local;
  SSPMSolver *this_local;
  
  if (*this->tmp_d != -1) {
    local_30._24_4_ = h;
    i = pindex;
    _h_local = this;
    if (pindex < this->tmp_d[this->l + -1]) {
      local_30._20_4_ = this->l;
      while( true ) {
        local_30._20_4_ = local_30._20_4_ + -1;
        bVar2 = false;
        if (-1 < (int)local_30._20_4_) {
          bVar2 = i < this->tmp_d[(int)local_30._20_4_];
        }
        if (!bVar2) break;
        bitset::operator[]((bitset *)local_30,(size_t)&this->tmp_b);
        bitset::reference::operator=((reference *)local_30,false);
        this->tmp_d[(int)local_30._20_4_] = i;
      }
      bitset::operator[]((bitset *)local_40,(size_t)&this->tmp_b);
      bitset::reference::operator=((reference *)local_40,true);
    }
    else {
      local_58._20_4_ = this->l;
      while (local_58._20_4_ = local_58._20_4_ + -1, -1 < (int)local_58._20_4_) {
        bitset::operator[]((bitset *)local_58,(size_t)&this->tmp_b);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_58);
        if (!bVar2) {
          if (this->tmp_d[(int)local_58._20_4_] == local_30._24_4_) {
            bitset::operator[]((bitset *)local_68,(size_t)&this->tmp_b);
            bitset::reference::operator=((reference *)local_68,true);
            return;
          }
          bitset::operator[]((bitset *)&k,(size_t)&this->tmp_b);
          bitset::reference::operator=((reference *)&k,false);
          iVar1 = this->tmp_d[(int)local_58._20_4_];
          for (local_80 = local_58._20_4_; local_80 < this->l; local_80 = local_80 + 1) {
            this->tmp_d[local_80] = iVar1 + 1;
          }
          return;
        }
        if (local_58._20_4_ == 0) {
          if (*this->tmp_d == 0) {
            bitset::operator[]((bitset *)local_90,(size_t)&this->tmp_b);
            bitset::reference::operator=((reference *)local_90,false);
            *this->tmp_d = -1;
            return;
          }
          local_94 = *this->tmp_d + -1;
          bitset::operator[]((bitset *)&new_d_2,(size_t)&this->tmp_b);
          bitset::reference::operator=((reference *)&new_d_2,true);
          for (local_ac = 0; local_ac < this->l; local_ac = local_ac + 1) {
            this->tmp_d[local_ac] = local_94;
          }
          return;
        }
        if (this->tmp_d[local_58._20_4_ + -1] != this->tmp_d[(int)local_58._20_4_]) {
          local_b0 = this->tmp_d[(int)local_58._20_4_] + -1;
          bitset::operator[]((bitset *)local_c0,(size_t)&this->tmp_b);
          bitset::reference::operator=((reference *)local_c0,true);
          for (local_d8._20_4_ = local_58._20_4_; (int)local_d8._20_4_ < this->l;
              local_d8._20_4_ = local_d8._20_4_ + 1) {
            this->tmp_d[(int)local_d8._20_4_] = local_b0;
          }
          return;
        }
        bitset::operator[]((bitset *)local_d8,(size_t)&this->tmp_b);
        bitset::reference::operator=((reference *)local_d8,false);
      }
    }
  }
  return;
}

Assistant:

void
SSPMSolver::prog_tmp(int pindex, int h)
{
    // Simple case 1: Top >_p Top
    if (tmp_d[0] == -1) return; // already Top

    // Simple case 2: Some bits below [pindex], ergo [pindex] can go from ..e to ..10*
    if (tmp_d[l-1] > pindex) {
        int i;
        for (i=l-1; i>=0 and tmp_d[i] > pindex; i--) {
            tmp_b[i] = 0;
            tmp_d[i] = pindex;
        }
        tmp_b[i+1] = 1;
        return;
    }

    // Case 3: no bits below [pindex], so analyze lowest nonempty level
    // * If lowest contains 0: 3a or 3b
    // * Else if lowest level is root: 3c
    // * Else append 100000000... to next higher level (3d, 3e, 3f)
    //
    // 3a: ,..011*  => ,..100*  (if lowest nonempty is the bottom)
    // 3b: ,..011*, => ,..,000* (if lowest nonempty is not the bottom)
    // 3c: 1111111  => Top      (if root contains only 1s)
    // 3d: ,1111111 => 100*     (if non-root contains only 1s)
    // 3e: ..,111*  => ..100*
    // 3f: ,e,111*  => ,100*

    // no bits below pindex, so just find smallest increase
    for (int i=l-1; i>=0; i--) {
        if (tmp_b[i] == 0) {
            if (tmp_d[i] == h) {
                // 3a: we found a 0 on the bottom, increase to 100...
                // ..011 => 00100
                tmp_b[i] = 1;
                break;
            } else {
                // 3b: we found a 0 (not bottom), increase to [eps] and 0s on leaf
                // ..011 => ..,000
                tmp_b[i] = 0;
                int new_d = tmp_d[i]+1;
                for (int k=i; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (i == 0) {
            // we have only seen 1s and only 1 element
            if (tmp_d[0] == 0) {
                // 3c: we are already the highest, so go to top
                tmp_b[0] = 0;
                tmp_d[0] = -1;
                break;
            } else {
                // 3d: increase 1 higher...
                // ,e,111   => ,100
                int new_d = tmp_d[0]-1;
                tmp_b[0] = 1;
                for (int k=0; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (tmp_d[i-1] != tmp_d[i]) {
            // 3e, 3f: next is different
            // two cases
            //  .,111   => .100
            // ,e,111   => ,100
            int new_d = tmp_d[i]-1;
            tmp_b[i] = 1;
            for (int k=i; k<l; k++) tmp_d[k] = new_d;
            break;
        } else {
            // next is same
            tmp_b[i] = 0;
        }
    }
}